

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tflags.h
# Opt level: O2

void A_Wander(AActor *self,int flags)

{
  SWORD *pSVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = (self->flags4).Value;
  (self->flags4).Value = uVar3 & 0xffff7fff;
  if ((uVar3 & 0x20000) != 0 || ((self->flags5).Value & 0x20000000) != 0) {
    return;
  }
  if (self->reactiontime != 0) {
    self->reactiontime = self->reactiontime + -1;
    return;
  }
  if (((flags & 0x40U) == 0) && (bVar2 = self->movedir, bVar2 < 8)) {
    dVar5 = floor((self->Angles).Yaw.Degrees / 45.0);
    dVar7 = 45.0;
    dVar5 = dVar5 * 45.0;
    dVar6 = (double)SUB84(((double)((uint)bVar2 * 0x2d) - dVar5) * 11930464.711111112 +
                          6755399441055744.0,0) * 8.381903171539307e-08;
    (self->Angles).Yaw.Degrees = dVar5;
    if (0.0 <= dVar6) {
      if (dVar6 <= 0.0) goto LAB_003fd3be;
    }
    else {
      dVar7 = -45.0;
    }
    (self->Angles).Yaw.Degrees = dVar5 + dVar7;
  }
LAB_003fd3be:
  pSVar1 = &self->movecount;
  *pSVar1 = *pSVar1 + -1;
  if (((flags & 0x20U) == 0 && *pSVar1 < 0) ||
     (bVar4 = P_Move(self), (flags & 0x100U) == 0 && !bVar4)) {
    P_RandomChaseDir(self);
    self->movecount = self->movecount + 5;
  }
  return;
}

Assistant:

Self& operator&= (Self other) { Value &= other.GetValue(); return *this; }